

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

uint16_t icu_63::writeFactorSuffix
                   (uint16_t *factors,uint16_t count,char *s,uint32_t code,uint16_t *indexes,
                   char **elementBases,char **elements,char *buffer,uint16_t bufferLength)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  uint16_t uVar4;
  ulong uVar5;
  uint16_t uVar6;
  short sVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((uint16_t)(count - 1) == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)(ushort)(count - 1);
    uVar5 = (ulong)code;
    uVar3 = uVar8;
    do {
      uVar9 = uVar3 - 1;
      uVar2 = uVar5 / factors[uVar3];
      code = (uint32_t)uVar2;
      indexes[uVar3] = (uint16_t)(uVar5 % (ulong)factors[uVar3]);
      uVar5 = uVar2;
      uVar3 = uVar9;
    } while ((short)uVar9 != 0);
  }
  *indexes = (uint16_t)code;
  uVar5 = 0;
  uVar4 = 0;
  while( true ) {
    if (elementBases == (char **)0x0) {
      elementBases = (char **)0x0;
    }
    else {
      *elementBases = s;
      elementBases = elementBases + 1;
    }
    for (uVar6 = indexes[uVar5]; uVar6 != 0; uVar6 = uVar6 - 1) {
      do {
        cVar1 = *s;
        s = s + 1;
      } while (cVar1 != '\0');
    }
    if (elements == (char **)0x0) {
      elements = (char **)0x0;
    }
    else {
      *elements = s;
      elements = elements + 1;
    }
    while( true ) {
      cVar1 = *s;
      s = s + 1;
      if (cVar1 == '\0') break;
      if (bufferLength == 0) {
        bufferLength = 0;
      }
      else {
        *buffer = cVar1;
        buffer = buffer + 1;
        bufferLength = bufferLength - 1;
      }
      uVar4 = uVar4 + 1;
    }
    if (uVar5 == uVar8) break;
    for (sVar7 = ~indexes[uVar5] + factors[uVar5]; sVar7 != 0; sVar7 = sVar7 + -1) {
      do {
        cVar1 = *s;
        s = s + 1;
      } while (cVar1 != '\0');
    }
    uVar5 = uVar5 + 1;
  }
  if (bufferLength != 0) {
    *buffer = '\0';
  }
  return uVar4;
}

Assistant:

static uint16_t
writeFactorSuffix(const uint16_t *factors, uint16_t count,
                  const char *s, /* suffix elements */
                  uint32_t code,
                  uint16_t indexes[8], /* output fields from here */
                  const char *elementBases[8], const char *elements[8],
                  char *buffer, uint16_t bufferLength) {
    uint16_t i, factor, bufferPos=0;
    char c;

    /* write elements according to the factors */

    /*
     * the factorized elements are determined by modulo arithmetic
     * with the factors of this algorithm
     *
     * note that for fewer operations, count is decremented here
     */
    --count;
    for(i=count; i>0; --i) {
        factor=factors[i];
        indexes[i]=(uint16_t)(code%factor);
        code/=factor;
    }
    /*
     * we don't need to calculate the last modulus because start<=code<=end
     * guarantees here that code<=factors[0]
     */
    indexes[0]=(uint16_t)code;

    /* write each element */
    for(;;) {
        if(elementBases!=NULL) {
            *elementBases++=s;
        }

        /* skip indexes[i] strings */
        factor=indexes[i];
        while(factor>0) {
            while(*s++!=0) {}
            --factor;
        }
        if(elements!=NULL) {
            *elements++=s;
        }

        /* write element */
        while((c=*s++)!=0) {
            WRITE_CHAR(buffer, bufferLength, bufferPos, c);
        }

        /* we do not need to perform the rest of this loop for i==count - break here */
        if(i>=count) {
            break;
        }

        /* skip the rest of the strings for this factors[i] */
        factor=(uint16_t)(factors[i]-indexes[i]-1);
        while(factor>0) {
            while(*s++!=0) {}
            --factor;
        }

        ++i;
    }

    /* zero-terminate */
    if(bufferLength>0) {
        *buffer=0;
    }

    return bufferPos;
}